

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  int iVar3;
  bool bVar4;
  
  if (((pParse->db->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    if (aChange == (int *)0x0) {
      pFVar2 = sqlite3FkReferences(pTab);
      if (pFVar2 != (FKey *)0x0) {
        return 1;
      }
      bVar4 = (pTab->u).tab.pFKey != (FKey *)0x0;
      iVar3 = 1;
    }
    else {
      pFVar2 = (FKey *)&pTab->u;
      bVar4 = false;
      iVar3 = 1;
      while (pFVar2 = pFVar2->pNextFrom, pFVar2 != (FKey *)0x0) {
        iVar1 = fkChildIsModified(pTab,pFVar2,aChange,chngRowid);
        if (iVar1 != 0) {
          iVar1 = sqlite3_stricmp(pTab->zName,pFVar2->zTo);
          if (iVar1 == 0) {
            iVar3 = 2;
          }
          bVar4 = true;
        }
      }
      for (pFVar2 = sqlite3FkReferences(pTab); pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextTo) {
        iVar1 = fkParentIsModified(pTab,pFVar2,aChange,chngRowid);
        if (((iVar1 != 0) && (bVar4 = true, (pParse->db->flags & 0x800000000) == 0)) &&
           (pFVar2->aAction[1] != '\0')) {
          return 2;
        }
      }
    }
    if (bVar4) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 1;                   /* Value to return if bHaveFK is true */
  int bHaveFK = 0;                /* If FK processing is required */
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the
      ** table in question is either the child or parent table for any
      ** foreign key constraint.  */
      bHaveFK = (sqlite3FkReferences(pTab) || pTab->u.tab.pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) eRet = 2;
          bHaveFK = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( (pParse->db->flags & SQLITE_FkNoAction)==0
           && p->aAction[1]!=OE_None
          ){
            return 2;
          }
          bHaveFK = 1;
        }
      }
    }
  }
  return bHaveFK ? eRet : 0;
}